

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

enum_<asd::scan_direction> * __thiscall
pybind11::enum_<asd::scan_direction>::value
          (enum_<asd::scan_direction> *this,char *name,scan_direction value,char *doc)

{
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar1;
  object local_30;
  scan_direction local_24;
  
  local_24 = value;
  pVar1 = detail::type_caster_generic::src_and_type
                    (&local_24,(type_info *)&asd::scan_direction::typeinfo,(type_info *)0x0);
  local_30.super_handle =
       detail::type_caster_generic::cast
                 (pVar1.first,copy,(handle)0x0,pVar1.second,
                  anon_func::anon_class_1_0_00000001::__invoke,
                  anon_func::anon_class_1_0_00000001::__invoke,(void *)0x0);
  detail::enum_base::value(&this->m_base,name,&local_30,doc);
  object::~object(&local_30);
  return this;
}

Assistant:

enum_ &value(char const *name, Type value, const char *doc = nullptr) {
        m_base.value(name, pybind11::cast(value, return_value_policy::copy), doc);
        return *this;
    }